

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ShadowTableName(sqlite3 *db,char *zName)

{
  int iVar1;
  char *pcVar2;
  Table *pTab;
  
  pcVar2 = strrchr(zName,0x5f);
  if (pcVar2 != (char *)0x0) {
    *pcVar2 = '\0';
    pTab = sqlite3FindTable(db,zName,(char *)0x0);
    *pcVar2 = '_';
    if ((pTab != (Table *)0x0) && (pTab->eTabType == '\x01')) {
      iVar1 = sqlite3IsShadowTableOf(db,pTab,zName);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3ShadowTableName(sqlite3 *db, const char *zName){
  char *zTail;                  /* Pointer to the last "_" in zName */
  Table *pTab;                  /* Table that zName is a shadow of */
  zTail = strrchr(zName, '_');
  if( zTail==0 ) return 0;
  *zTail = 0;
  pTab = sqlite3FindTable(db, zName, 0);
  *zTail = '_';
  if( pTab==0 ) return 0;
  if( !IsVirtual(pTab) ) return 0;
  return sqlite3IsShadowTableOf(db, pTab, zName);
}